

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O3

bool __thiscall
anurbs::RTree<2L>::PickByRay::operator()(PickByRay *this,Vector *box_min,Vector *box_max)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  Vector *pVVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  double local_48 [2];
  undefined1 local_38 [8];
  Vector max_t;
  double dStack_20;
  Vector candidate_plane;
  
  lVar5 = 0;
  local_38 = (undefined1  [8])0x0;
  max_t.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0] = 0.0
  ;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  max_t.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] = 0.0
  ;
  dStack_20 = 0.0;
  bVar1 = true;
  pVVar6 = (Vector *)local_38;
  pdVar7 = max_t.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
           + 1;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    dVar10 = (this->m_origin).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage
             .m_data.array[lVar5];
    dVar9 = (box_min->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data
            .array[lVar5];
    if (dVar9 <= dVar10) {
      dVar9 = (box_max->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
              m_data.array[lVar5];
      if (dVar9 < dVar10) {
        (pVVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
        array[0] = 4.94065645841247e-324;
        goto LAB_001c735d;
      }
      (pVVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array
      [0] = 0.0;
    }
    else {
      (pVVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array
      [0] = -NAN;
LAB_001c735d:
      *pdVar7 = dVar9;
      bVar1 = false;
    }
    lVar5 = 1;
    pVVar6 = &max_t;
    pdVar7 = &dStack_20;
    bVar2 = false;
  } while (bVar3);
  bVar2 = true;
  if (!bVar1) {
    lVar5 = 0;
    pdVar7 = local_48;
    pdVar8 = max_t.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
             array + 1;
    pVVar6 = (Vector *)local_38;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      if ((pVVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
          array[0] == 0.0) {
LAB_001c73df:
        *pdVar7 = -1.0;
      }
      else {
        dVar10 = (this->m_direction).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                 m_storage.m_data.array[lVar5];
        if ((dVar10 == 0.0) && (!NAN(dVar10))) goto LAB_001c73df;
        *pdVar7 = (*pdVar8 -
                  (this->m_origin).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                  m_storage.m_data.array[lVar5]) / dVar10;
      }
      lVar5 = 1;
      pdVar7 = local_48 + 1;
      pdVar8 = &dStack_20;
      pVVar6 = &max_t;
      bVar1 = false;
    } while (bVar2);
    if (0.0 <= local_48[local_48[0] < local_48[1]]) {
      uVar4 = 0;
      bVar1 = true;
      do {
        while (bVar2 = bVar1, uVar4 != local_48[0] < local_48[1]) {
          dVar10 = (this->m_direction).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                   m_storage.m_data.array[uVar4] * local_48[local_48[0] < local_48[1]] +
                   (this->m_origin).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                   m_storage.m_data.array[uVar4];
          if (dVar10 < (box_min->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                       m_storage.m_data.array[uVar4]) goto LAB_001c741a;
          pdVar7 = (box_max->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage
                   .m_data.array + uVar4;
          bVar3 = dVar10 < *pdVar7 || dVar10 == *pdVar7;
          uVar4 = 1;
          bVar1 = false;
          if (!(bool)(bVar3 & bVar2)) {
            return bVar3;
          }
        }
        uVar4 = 1;
        bVar1 = false;
      } while (bVar2);
      bVar2 = true;
    }
    else {
LAB_001c741a:
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool operator()(const Vector box_min, const Vector box_max) const noexcept
        {
            // based on Fast Ray-Box Intersection
            // by Andrew Woo
            // from "Graphics Gems", Academic Press, 1990

            bool inside = true;
            VectorU quadrant = VectorU::Zero(); // FIXME: choose other type...
            int which_plane = 0;
            Vector max_t = Vector::Zero();
            Vector candidate_plane = Vector::Zero();
            Vector coordinate = Vector::Zero();

            for (Index i = 0; i < TDimension; i++) {
                if (m_origin[i] < box_min[i]) {
                    quadrant[i] = -1;
                    candidate_plane[i] = box_min[i];
                    inside = false;
                } else if (m_origin[i] > box_max[i]) {
                    quadrant[i] = 1;
                    candidate_plane[i] = box_max[i];
                    inside = false;
                } else {
                    quadrant[i] = 0;
                }
            }

            if (inside) {
                coordinate = m_origin;
                return true;
            }

            for (Index i = 0; i < TDimension; i++) {
                if (quadrant[i] != 0 && m_direction[i] != 0) {
                    max_t[i] = (candidate_plane[i] - m_origin[i]) / m_direction[i];
                } else {
                    max_t[i] = -1;
                }
            }

            which_plane = 0;
            
            for (Index i = 1; i < TDimension; i++) {
                if (max_t[which_plane] < max_t[i]) {
                    which_plane = i;
                }
            }

            if (max_t[which_plane] < 0) {
                return false;
            }

            for (Index i = 0; i < TDimension; i++) {
                if (which_plane != i) {
                    coordinate[i] = m_origin[i] + max_t[which_plane] * m_direction[i];
                    if (coordinate[i] < box_min[i] || coordinate[i] > box_max[i]) {
                        return false;
                    }
                } else {
                    coordinate[i] = candidate_plane[i];
                }
            }

            return true;
        }